

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockResult.cxx
# Opt level: O0

cmFileLockResult cmFileLockResult::MakeSystem(void)

{
  int *piVar1;
  cmFileLockResult cStack_10;
  Error lastError;
  
  piVar1 = __errno_location();
  cmFileLockResult(&stack0xfffffffffffffff0,SYSTEM,*piVar1);
  return cStack_10;
}

Assistant:

cmFileLockResult cmFileLockResult::MakeSystem()
{
#if defined(_WIN32)
  const Error lastError = GetLastError();
#else
  const Error lastError = errno;
#endif
  return cmFileLockResult(SYSTEM, lastError);
}